

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O0

Var Js::JavascriptArray::SliceObjectHelper
              (RecyclableObject *obj,uint32 sliceStart,uint32 start,JavascriptArray *newArr,
              RecyclableObject *newObj,uint32 newLen,ScriptContext *scriptContext)

{
  BOOL BVar1;
  ThreadContext *threadContext;
  Var pvVar2;
  JavascriptArray *pJVar3;
  JavascriptArray *jsArr;
  Var element;
  uint local_60;
  BOOL hasItem;
  uint32 i;
  undefined1 local_50 [8];
  JsReentLock jsReentLock;
  uint32 newLen_local;
  RecyclableObject *newObj_local;
  JavascriptArray *newArr_local;
  uint32 start_local;
  uint32 sliceStart_local;
  RecyclableObject *obj_local;
  
  jsReentLock._28_4_ = newLen;
  threadContext = ScriptContext::GetThreadContext(scriptContext);
  JsReentLock::JsReentLock((JsReentLock *)local_50,threadContext);
  JsReentLock::setObjectForMutation((JsReentLock *)local_50,obj);
  for (local_60 = start; local_60 < (uint)jsReentLock._28_4_; local_60 = local_60 + 1) {
    JsReentLock::unlock((JsReentLock *)local_50);
    BVar1 = Js::JavascriptOperators::HasItem(obj,local_60 + sliceStart);
    JsReentLock::MutateArrayObject((JsReentLock *)local_50);
    JsReentLock::relock((JsReentLock *)local_50);
    if (BVar1 != 0) {
      JsReentLock::unlock((JsReentLock *)local_50);
      pvVar2 = Js::JavascriptOperators::GetItem(obj,local_60 + sliceStart,scriptContext);
      JsReentLock::MutateArrayObject((JsReentLock *)local_50);
      JsReentLock::relock((JsReentLock *)local_50);
      if (newArr == (JavascriptArray *)0x0) {
        JsReentLock::unlock((JsReentLock *)local_50);
        BVar1 = SetArrayLikeObjects(newObj,local_60,pvVar2);
        ThrowErrorOnFailure(BVar1,scriptContext,local_60);
        JsReentLock::MutateArrayObject((JsReentLock *)local_50);
        JsReentLock::relock((JsReentLock *)local_50);
      }
      else {
        (*(newArr->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
          super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
                  (newArr,(ulong)local_60,pvVar2,0);
      }
    }
  }
  JsReentLock::unlock((JsReentLock *)local_50);
  pvVar2 = JavascriptNumber::ToVar(jsReentLock._28_4_,scriptContext);
  Js::JavascriptOperators::SetProperty
            (newObj,newObj,0xd1,pvVar2,scriptContext,PropertyOperation_ThrowIfNotExtensible);
  JsReentLock::MutateArrayObject((JsReentLock *)local_50);
  JsReentLock::relock((JsReentLock *)local_50);
  pJVar3 = TryVarToNonES5Array(newObj);
  if (pJVar3 != (JavascriptArray *)0x0) {
    (*(pJVar3->super_ArrayObject).super_DynamicObject.super_RecyclableObject.super_FinalizableObject
      .super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x74])();
  }
  JsReentLock::~JsReentLock((JsReentLock *)local_50);
  return newObj;
}

Assistant:

Var JavascriptArray::SliceObjectHelper(RecyclableObject* obj, uint32 sliceStart, uint32 start, JavascriptArray* newArr, RecyclableObject* newObj, uint32 newLen, ScriptContext* scriptContext)
    {
        JS_REENTRANCY_LOCK(jsReentLock, scriptContext->GetThreadContext());
        SETOBJECT_FOR_MUTATION(jsReentLock, obj);

        for (uint32 i = start; i < newLen; i++)
        {
            JS_REENTRANT(jsReentLock, BOOL hasItem = JavascriptOperators::HasItem(obj, i + sliceStart));
            if (hasItem)
            {
                JS_REENTRANT(jsReentLock, Var element = JavascriptOperators::GetItem(obj, i + sliceStart, scriptContext));
                if (newArr != nullptr)
                {
                    newArr->SetItem(i, element, PropertyOperation_None);
                }
                else
                {
                    JS_REENTRANT(jsReentLock, ThrowErrorOnFailure(JavascriptArray::SetArrayLikeObjects(newObj, i, element), scriptContext, i));
                }
            }
        }

        JS_REENTRANT(jsReentLock,
            JavascriptOperators::SetProperty(newObj, newObj, Js::PropertyIds::length, JavascriptNumber::ToVar(newLen, scriptContext), scriptContext, PropertyOperation_ThrowIfNotExtensible));

#ifdef VALIDATE_ARRAY
        JavascriptArray * jsArr = JavascriptArray::TryVarToNonES5Array(newObj);
        if (jsArr)
        {
            jsArr->ValidateArray();
        }
#endif

        return newObj;
    }